

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRngPErrMemory(xmlRelaxNGParserCtxtPtr ctxt)

{
  void *local_28;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  channel = (xmlGenericErrorFunc)0x0;
  data = (void *)0x0;
  local_28 = (void *)0x0;
  if (ctxt != (xmlRelaxNGParserCtxtPtr)0x0) {
    if (ctxt->serror == (xmlStructuredErrorFunc)0x0) {
      data = ctxt->error;
    }
    else {
      channel = (xmlGenericErrorFunc)ctxt->serror;
    }
    local_28 = ctxt->userData;
    ctxt->nbErrors = ctxt->nbErrors + 1;
  }
  xmlRaiseMemoryError((xmlStructuredErrorFunc)channel,(xmlGenericErrorFunc)data,local_28,0x12,
                      (xmlError *)0x0);
  return;
}

Assistant:

static void
xmlRngPErrMemory(xmlRelaxNGParserCtxtPtr ctxt)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        if (ctxt->serror != NULL)
	    schannel = ctxt->serror;
	else
	    channel = ctxt->error;
        data = ctxt->userData;
        ctxt->nbErrors++;
    }

    xmlRaiseMemoryError(schannel, channel, data, XML_FROM_RELAXNGP, NULL);
}